

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>>::
emplace<QModelIndex_const&,QModelIndex&>
          (QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>> *this,qsizetype i,
          QModelIndex *args,QModelIndex *args_1)

{
  undefined8 *puVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  quintptr qVar5;
  QPersistentModelIndex QVar6;
  pair<QModelIndex,_QPersistentModelIndex> *__dest;
  long in_FS_OFFSET;
  Inserter local_80;
  undefined8 local_58;
  quintptr qStack_50;
  QAbstractItemModel *local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0048bb06:
    local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_4_ = args->r;
    local_58._4_4_ = args->c;
    qStack_50 = args->i;
    local_48 = (args->m).ptr;
    QPersistentModelIndex::QPersistentModelIndex(&local_40,args_1);
    lVar4 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,
               (uint)(i == 0 && lVar4 != 0),1,(pair<QModelIndex,_QPersistentModelIndex> **)0x0,
               (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0);
    QVar6.d = local_40.d;
    if (i == 0 && lVar4 != 0) {
      lVar4 = *(long *)(this + 8);
      *(QAbstractItemModel **)(lVar4 + -0x10) = local_48;
      *(undefined8 *)(lVar4 + -0x20) = local_58;
      *(quintptr *)(lVar4 + -0x18) = qStack_50;
      local_40.d = (QPersistentModelIndexData *)0x0;
      *(QPersistentModelIndexData **)(lVar4 + -8) = QVar6.d;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      puVar1 = (undefined8 *)(*(long *)(this + 8) + i * 0x20);
      __dest = (pair<QModelIndex,_QPersistentModelIndex> *)(puVar1 + 4);
      local_80.nInserts = 1;
      local_80.bytes = (*(long *)(this + 0x10) - i) * 0x20;
      local_80.data = (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this;
      local_80.displaceTo = __dest;
      memmove(__dest,(void *)(*(long *)(this + 8) + i * 0x20),local_80.bytes);
      QVar6.d = local_40.d;
      *puVar1 = local_58;
      puVar1[1] = qStack_50;
      puVar1[2] = local_48;
      local_40.d = (QPersistentModelIndexData *)0x0;
      puVar1[3] = QVar6.d;
      local_80.displaceFrom = __dest;
      QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::~Inserter
                (&local_80);
    }
    QPersistentModelIndex::~QPersistentModelIndex(&local_40);
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (*(long *)(piVar2 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      puVar1 = (undefined8 *)(*(long *)(this + 8) + i * 0x20);
      puVar1[2] = (args->m).ptr;
      qVar5 = args->i;
      *puVar1 = *(undefined8 *)args;
      puVar1[1] = qVar5;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(puVar1 + 3),args_1);
    }
    else {
      if ((i != 0) ||
         (uVar3 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar3))
      goto LAB_0048bb06;
      *(QAbstractItemModel **)(uVar3 - 0x10) = (args->m).ptr;
      qVar5 = args->i;
      *(undefined8 *)(uVar3 - 0x20) = *(undefined8 *)args;
      *(quintptr *)(uVar3 - 0x18) = qVar5;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(uVar3 - 8),args_1);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }